

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void * lua_newuserdata(lua_State *L,size_t size)

{
  StkId pTVar1;
  Table *e;
  GCObject *pGVar2;
  TValue *i_o;
  Udata *u;
  size_t size_local;
  lua_State *L_local;
  
  if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
    luaC_step(L);
  }
  e = getcurrenv(L);
  pGVar2 = (GCObject *)luaS_newudata(L,size,e);
  pTVar1 = L->top;
  (pTVar1->value).gc = pGVar2;
  pTVar1->tt = 7;
  L->top = L->top + 1;
  return &pGVar2->u + 1;
}

Assistant:

static void*lua_newuserdata(lua_State*L,size_t size){
Udata*u;
luaC_checkGC(L);
u=luaS_newudata(L,size,getcurrenv(L));
setuvalue(L,L->top,u);
api_incr_top(L);
return u+1;
}